

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::FunctionBody::DoTraceExecutionMode(FunctionBody *this,char *eventDescription)

{
  code *pcVar1;
  bool bVar2;
  ExecutionMode executionMode;
  uint uVar3;
  LocalFunctionId functionId;
  int iVar4;
  undefined4 *puVar5;
  undefined4 extraout_var;
  char16 *pcVar6;
  char *pcVar7;
  wchar local_78 [4];
  char16 functionIdString [42];
  char *eventDescription_local;
  FunctionBody *this_local;
  
  uVar3 = FunctionProxy::GetSourceContextId((FunctionProxy *)this);
  functionId = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
  bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,ExecutionModePhase,uVar3,functionId);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1bcf,
                                "(Js::Configuration::Global.flags.Trace.IsEnabled(((Phase::ExecutionModePhase)), ((this)->GetSourceContextId()), ((this)->GetLocalFunctionId())))"
                                ,"PHASE_TRACE(Phase::ExecutionModePhase, this)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  FunctionExecutionStateMachine::AssertIsInitialized(&this->executionState);
  iVar4 = (*(this->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
  pcVar6 = FunctionProxy::GetDebugNumberSet((FunctionProxy *)this,(wchar (*) [42])local_78);
  executionMode = FunctionExecutionStateMachine::GetExecutionMode(&this->executionState);
  pcVar7 = ExecutionModeName(executionMode);
  uVar3 = GetByteCodeCount(this);
  Output::Print(L"ExecutionMode - function: %s (%s), mode: %S, size: %u, ",
                CONCAT44(extraout_var,iVar4),pcVar6,pcVar7,(ulong)uVar3);
  FunctionExecutionStateMachine::PrintLimits(&this->executionState);
  if (eventDescription != (char *)0x0) {
    Output::Print(L", event: %S",eventDescription);
  }
  Output::Print(L"\n");
  Output::Flush();
  return;
}

Assistant:

void FunctionBody::DoTraceExecutionMode(const char *const eventDescription) const
    {
        Assert(PHASE_TRACE(Phase::ExecutionModePhase, this));
        executionState.AssertIsInitialized();

        char16 functionIdString[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        Output::Print(
            _u("ExecutionMode - ")
                _u("function: %s (%s), ")
                _u("mode: %S, ")
                _u("size: %u, "),
            GetDisplayName(),
                GetDebugNumberSet(functionIdString),
            ExecutionModeName(executionState.GetExecutionMode()),
            GetByteCodeCount());

        executionState.PrintLimits();

        if(eventDescription)
        {
            Output::Print(_u(", event: %S"), eventDescription);
        }

        Output::Print(_u("\n"));
        Output::Flush();
    }